

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O2

void sse::Minimum(uint32_t rowSizeIn1,uint32_t rowSizeIn2,uint32_t rowSizeOut,uint8_t *in1Y,
                 uint8_t *in2Y,uint8_t *outY,uint8_t *outYEnd,uint32_t simdWidth,
                 uint32_t totalSimdWidth,uint32_t nonSimdWidth)

{
  undefined1 auVar1 [16];
  uint8_t *puVar2;
  long lVar3;
  ulong uVar4;
  byte bVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  
  uVar4 = (ulong)totalSimdWidth;
  puVar6 = in1Y + uVar4;
  puVar7 = in2Y + uVar4;
  puVar2 = outY + uVar4;
  for (; outY != outYEnd; outY = outY + rowSizeOut) {
    for (lVar3 = 0; (ulong)simdWidth << 4 != lVar3; lVar3 = lVar3 + 0x10) {
      auVar1 = vpminub_avx(*(undefined1 (*) [16])(in1Y + lVar3),*(undefined1 (*) [16])(in2Y + lVar3)
                          );
      *(undefined1 (*) [16])(outY + lVar3) = auVar1;
    }
    if (nonSimdWidth != 0) {
      for (uVar4 = 0; nonSimdWidth != uVar4; uVar4 = uVar4 + 1) {
        bVar5 = puVar6[uVar4];
        if (puVar7[uVar4] < puVar6[uVar4]) {
          bVar5 = puVar7[uVar4];
        }
        puVar2[uVar4] = bVar5;
      }
    }
    in1Y = in1Y + rowSizeIn1;
    in2Y = in2Y + rowSizeIn2;
    puVar6 = puVar6 + rowSizeIn1;
    puVar7 = puVar7 + rowSizeIn2;
    puVar2 = puVar2 + rowSizeOut;
  }
  return;
}

Assistant:

void Minimum( uint32_t rowSizeIn1, uint32_t rowSizeIn2, uint32_t rowSizeOut, const uint8_t * in1Y, const uint8_t * in2Y,
                  uint8_t * outY, const uint8_t * outYEnd, uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        for( ; outY != outYEnd; outY += rowSizeOut, in1Y += rowSizeIn1, in2Y += rowSizeIn2 ) {
            const simd * src1 = reinterpret_cast <const simd*> (in1Y);
            const simd * src2 = reinterpret_cast <const simd*> (in2Y);
            simd       * dst  = reinterpret_cast <simd*> (outY);

            const simd * src1End = src1 + simdWidth;

            for( ; src1 != src1End; ++src1, ++src2, ++dst )
                _mm_storeu_si128( dst, _mm_min_epu8( _mm_loadu_si128( src1 ), _mm_loadu_si128( src2 ) ) );

            if( nonSimdWidth > 0 ) {
                const uint8_t * in1X = in1Y + totalSimdWidth;
                const uint8_t * in2X = in2Y + totalSimdWidth;
                uint8_t       * outX = outY + totalSimdWidth;

                const uint8_t * outXEnd = outX + nonSimdWidth;

                for( ; outX != outXEnd; ++outX, ++in1X, ++in2X ) {
                    if( (*in2X) > (*in1X) )
                        (*outX) = (*in1X);
                    else
                        (*outX) = (*in2X);
                }
            }
        }
    }